

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::Operation::execute(Operation *this,Thread *t)

{
  int iVar1;
  bool bVar2;
  Result RVar3;
  GLenum GVar4;
  deBool dVar5;
  size_type sVar6;
  reference this_00;
  Event *pEVar7;
  reference this_01;
  FenceSync *pFVar8;
  MessageBuilder *pMVar9;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_6b0;
  SharedPtr<tcu::ThreadUtil::Event> local_6a0;
  MessageBuilder local_690;
  MessageBuilder local_500;
  MessageBuilder local_370;
  MessageBuilder local_1e0;
  EGLThread *local_50;
  EGLThread *eglThread_1;
  EGLThread *local_38;
  EGLThread *eglThread;
  int local_28;
  int depNdx_1;
  int depNdx;
  bool success;
  EGLThread *thread;
  Thread *t_local;
  Operation *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  _depNdx = (EGLThread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0)
  ;
  if (_depNdx == (EGLThread *)0x0) {
    __cxa_bad_cast();
  }
  depNdx_1._3_1_ = 1;
  for (local_28 = 0; iVar1 = local_28,
      sVar6 = std::
              vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
              ::size(&(this->super_Operation).m_deps), iVar1 < (int)sVar6; local_28 = local_28 + 1)
  {
    this_00 = std::
              vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
              ::operator[](&(this->super_Operation).m_deps,(long)local_28);
    pEVar7 = de::SharedPtr<tcu::ThreadUtil::Event>::operator->(this_00);
    RVar3 = tcu::ThreadUtil::Event::waitReady(pEVar7);
    if (RVar3 == RESULT_NOT_READY) {
      depNdx_1._3_1_ = 0;
    }
  }
  if ((depNdx_1._3_1_ & 1) != 0) {
    if ((this->m_useSync & 1U) != 0) {
      for (eglThread._4_4_ = 0; iVar1 = eglThread._4_4_,
          sVar6 = std::
                  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
                  ::size(&this->m_syncDeps), iVar1 < (int)sVar6;
          eglThread._4_4_ = eglThread._4_4_ + 1) {
        local_38 = _depNdx;
        this_01 = std::
                  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
                  ::operator[](&this->m_syncDeps,(long)eglThread._4_4_);
        pFVar8 = de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::operator->(this_01);
        bVar2 = FenceSync::waitReady(pFVar8,local_38);
        if (!bVar2) {
          depNdx_1._3_1_ = 0;
          break;
        }
      }
    }
    if ((depNdx_1._3_1_ & 1) != 0) {
      (*(this->super_Operation)._vptr_Operation[2])(this,_depNdx);
      if ((this->m_useSync & 1U) == 0) {
        tcu::ThreadUtil::Thread::newMessage(&local_500,&_depNdx->super_Thread);
        pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<
                           (&local_500,(char (*) [20])"Begin -- glFinish()");
        tcu::ThreadUtil::MessageBuilder::operator<<
                  (pMVar9,(EndToken *)&tcu::ThreadUtil::Message::End);
        tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_500);
        do {
          (*_depNdx->gl->finish)();
          GVar4 = (*_depNdx->gl->getError)();
          glu::checkError(GVar4,"finish()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                          ,0x1ed);
          dVar5 = ::deGetFalse();
        } while (dVar5 != 0);
        tcu::ThreadUtil::Thread::newMessage(&local_690,&_depNdx->super_Thread);
        pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<
                           (&local_690,(char (*) [18])"End -- glFinish()");
        tcu::ThreadUtil::MessageBuilder::operator<<
                  (pMVar9,(EndToken *)&tcu::ThreadUtil::Message::End);
        tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_690);
      }
      else {
        local_50 = _depNdx;
        pFVar8 = de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::operator->(&this->m_sync);
        FenceSync::init(pFVar8,(EVP_PKEY_CTX *)local_50);
        tcu::ThreadUtil::Thread::newMessage(&local_1e0,&_depNdx->super_Thread);
        pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<
                           (&local_1e0,(char (*) [19])"Begin -- glFlush()");
        tcu::ThreadUtil::MessageBuilder::operator<<
                  (pMVar9,(EndToken *)&tcu::ThreadUtil::Message::End);
        tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1e0);
        do {
          (*_depNdx->gl->flush)();
          GVar4 = (*_depNdx->gl->getError)();
          glu::checkError(GVar4,"flush()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                          ,0x1e7);
          dVar5 = ::deGetFalse();
        } while (dVar5 != 0);
        tcu::ThreadUtil::Thread::newMessage(&local_370,&_depNdx->super_Thread);
        pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<
                           (&local_370,(char (*) [17])"End -- glFlush()");
        tcu::ThreadUtil::MessageBuilder::operator<<
                  (pMVar9,(EndToken *)&tcu::ThreadUtil::Message::End);
        tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_370);
      }
    }
  }
  if ((depNdx_1._3_1_ & 1) == 0) {
    pEVar7 = de::SharedPtr<tcu::ThreadUtil::Event>::operator->(&(this->super_Operation).m_event);
    tcu::ThreadUtil::Event::setResult(pEVar7,RESULT_FAILED);
  }
  else {
    pEVar7 = de::SharedPtr<tcu::ThreadUtil::Event>::operator->(&(this->super_Operation).m_event);
    tcu::ThreadUtil::Event::setResult(pEVar7,RESULT_OK);
  }
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::clear(&(this->super_Operation).m_deps);
  de::SharedPtr<tcu::ThreadUtil::Event>::SharedPtr(&local_6a0);
  de::SharedPtr<tcu::ThreadUtil::Event>::operator=(&(this->super_Operation).m_event,&local_6a0);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_6a0);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::clear(&this->m_syncDeps);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::SharedPtr(&local_6b0);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::operator=(&this->m_sync,&local_6b0);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::~SharedPtr(&local_6b0);
  return;
}

Assistant:

void Operation::execute (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	bool success = true;

	// Wait for dependencies and check that they succeeded
	for (int depNdx = 0; depNdx < (int)m_deps.size(); depNdx++)
	{
		if (!m_deps[depNdx]->waitReady())
			success = false;
	}

	// Try execute operation
	if (success)
	{
		try
		{
			if (m_useSync)
			{
				for (int depNdx = 0; depNdx < (int)m_syncDeps.size(); depNdx++)
				{
					EGLThread* eglThread = dynamic_cast<EGLThread*>(&thread);
					DE_ASSERT(eglThread);
					if (m_syncDeps[depNdx]->waitReady(*eglThread) != tcu::ThreadUtil::Event::RESULT_OK)
					{
						success = false;
						break;
					}
				}
			}

			if (success)
			{
				exec(thread);
				if (m_useSync)
				{
					EGLThread* eglThread = dynamic_cast<EGLThread*>(&thread);
					DE_ASSERT(eglThread);
					m_sync->init(*eglThread, m_serverSync);
					thread.newMessage() << "Begin -- glFlush()" << tcu::ThreadUtil::Message::End;
					GLU_CHECK_GLW_CALL(thread.gl, flush());
					thread.newMessage() << "End -- glFlush()" << tcu::ThreadUtil::Message::End;
				}
				else
				{
					thread.newMessage() << "Begin -- glFinish()" << tcu::ThreadUtil::Message::End;
					GLU_CHECK_GLW_CALL(thread.gl, finish());
					thread.newMessage() << "End -- glFinish()" << tcu::ThreadUtil::Message::End;
				}
			}
		}
		catch (...)
		{
			// Got exception event failed
			m_event->setResult(tcu::ThreadUtil::Event::RESULT_FAILED);
			throw;
		}
	}

	if (success)
		m_event->setResult(tcu::ThreadUtil::Event::RESULT_OK);
	else
		m_event->setResult(tcu::ThreadUtil::Event::RESULT_FAILED);

	m_deps.clear();
	m_event = SharedPtr<tcu::ThreadUtil::Event>();
	m_syncDeps.clear();
	m_sync = SharedPtr<FenceSync>();
}